

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  TestCaseInfo *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  TestCaseInfo *in_R8;
  byte in_R9B;
  
  *in_RDI = &PTR__TestCaseStats_003a09b0;
  TestCaseInfo::TestCaseInfo(in_RCX,in_R8);
  in_RDI[0x1c] = in_RDX[6];
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  uVar3 = in_RDX[2];
  uVar4 = in_RDX[3];
  uVar5 = in_RDX[5];
  in_RDI[0x1a] = in_RDX[4];
  in_RDI[0x1b] = uVar5;
  in_RDI[0x18] = uVar3;
  in_RDI[0x19] = uVar4;
  in_RDI[0x16] = uVar1;
  in_RDI[0x17] = uVar2;
  std::__cxx11::string::string((string *)(in_RDI + 0x1d),(string *)in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 0x21),(string *)in_R8);
  *(byte *)(in_RDI + 0x25) = in_R9B & 1;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string const& _stdOut,
                                   std::string const& _stdErr,
                                   bool _aborting )
    : testInfo( _testInfo ),
        totals( _totals ),
        stdOut( _stdOut ),
        stdErr( _stdErr ),
        aborting( _aborting )
    {}